

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O0

void smallDeletions(RefVector *ref,vector<SoftCluster,_std::allocator<SoftCluster>_> *scClustersUp,
                   vector<SoftCluster,_std::allocator<SoftCluster>_> *scClustersDown,
                   vector<OutNode,_std::allocator<OutNode>_> *smallOutput)

{
  undefined1 t_st [4];
  bool bVar1;
  int iVar2;
  reference pSVar3;
  size_type sVar4;
  const_reference pvVar5;
  size_type sVar6;
  const_reference t_chr;
  undefined1 local_138 [8];
  OutNode on;
  pair<int,_int> sup;
  int curSup;
  int i;
  int bestSup;
  int bestIdx;
  undefined1 local_d0 [4];
  int stBound;
  SoftCluster scUp;
  const_iterator __end1;
  const_iterator __begin1;
  vector<SoftCluster,_std::allocator<SoftCluster>_> *__range1;
  vector<OutNode,_std::allocator<OutNode>_> *smallOutput_local;
  vector<SoftCluster,_std::allocator<SoftCluster>_> *scClustersDown_local;
  vector<SoftCluster,_std::allocator<SoftCluster>_> *scClustersUp_local;
  RefVector *ref_local;
  
  __end1 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::begin(scClustersUp);
  scUp.nodes.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage =
       (pointer)std::vector<SoftCluster,_std::allocator<SoftCluster>_>::end(scClustersUp);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_SoftCluster_*,_std::vector<SoftCluster,_std::allocator<SoftCluster>_>_>
                                     *)&scUp.nodes.
                                        super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage), bVar1) {
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_SoftCluster_*,_std::vector<SoftCluster,_std::allocator<SoftCluster>_>_>
             ::operator*(&__end1);
    SoftCluster::SoftCluster((SoftCluster *)local_d0,pSVar3);
    sup.second = getIdx((int)local_d0 + 0x2d,scClustersDown);
    if (sup.second != -1) {
      i = -1;
      curSup = 0;
      while ((sVar4 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::size(scClustersDown),
             (ulong)(long)sup.second < sVar4 &&
             (pvVar5 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at
                                 (scClustersDown,(long)sup.second),
             (pvVar5->info).scPos - (int)local_d0 < 0x1fa))) {
        pvVar5 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at
                           (scClustersDown,(long)sup.second);
        if (0x2c < (pvVar5->info).scPos - (int)local_d0) {
          pvVar5 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at
                             (scClustersDown,(long)sup.second);
          bVar1 = overlapCC((SoftCluster *)local_d0,pvVar5);
          if (bVar1) {
            sVar4 = std::vector<SoftNode,_std::allocator<SoftNode>_>::size
                              ((vector<SoftNode,_std::allocator<SoftNode>_> *)&scUp.info.scAtRight);
            pvVar5 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at
                               (scClustersDown,(long)sup.second);
            sVar6 = std::vector<SoftNode,_std::allocator<SoftNode>_>::size(&pvVar5->nodes);
            iVar2 = (int)sVar4 + (int)sVar6;
            if (curSup < iVar2) {
              i = sup.second;
              curSup = iVar2;
            }
          }
        }
        sup.second = sup.second + 1;
      }
      if (i != -1) {
        pvVar5 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at(scClustersDown,(long)i);
        on._48_8_ = calcSup((vector<SoftNode,_std::allocator<SoftNode>_> *)&scUp.info.scAtRight,
                            &pvVar5->nodes);
        t_chr = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                          (ref,(long)scUp.info.start);
        t_st = local_d0;
        pvVar5 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at(scClustersDown,(long)i);
        OutNode::OutNode((OutNode *)local_138,&t_chr->RefName,(int)t_st,(pvVar5->info).scPos,0,
                         on.supSC,on._52_4_);
        std::vector<OutNode,std::allocator<OutNode>>::emplace_back<OutNode&>
                  ((vector<OutNode,std::allocator<OutNode>> *)smallOutput,(OutNode *)local_138);
        OutNode::~OutNode((OutNode *)local_138);
      }
    }
    SoftCluster::~SoftCluster((SoftCluster *)local_d0);
    __gnu_cxx::
    __normal_iterator<const_SoftCluster_*,_std::vector<SoftCluster,_std::allocator<SoftCluster>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void smallDeletions(const BamTools::RefVector &ref, const std::vector<SoftCluster> &scClustersUp, const std::vector<SoftCluster> &scClustersDown, std::vector<OutNode> &smallOutput)
{
	for (SoftCluster scUp : scClustersUp)
	{
		int stBound = getIdx(scUp.info.scPos + MIN_SMALL_DEL_LEN, scClustersDown);

		if (stBound == -1)
			continue;

		int bestIdx = -1, bestSup = 0;
		for (int i = stBound; i < scClustersDown.size(); ++i)
		{
			if (scClustersDown.at(i).info.scPos - scUp.info.scPos > MAX_SMALL_DEL_LEN)
				break;
			if (scClustersDown.at(i).info.scPos - scUp.info.scPos < MIN_SMALL_DEL_LEN)
				continue;
			if (overlapCC(scUp, scClustersDown.at(i)))
			{
				int curSup = scUp.nodes.size() + scClustersDown.at(i).nodes.size();
				if (curSup > bestSup)
				{
					bestSup = curSup;
					bestIdx = i;
				}
			}
		}
		if (bestIdx != -1)
		{
			std::pair<int, int> sup = calcSup(scUp.nodes, scClustersDown.at(bestIdx).nodes);
			OutNode on(ref.at(scUp.info.refID).RefName, scUp.info.scPos, scClustersDown.at(bestIdx).info.scPos, 0, sup.first, sup.second);
			smallOutput.emplace_back(on);
		}
	}
}